

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O0

void fill_cache(cacheblock_t *cache,size_t N,size_t depth)

{
  bool bVar1;
  uint local_2c;
  ulong uStack_28;
  uint j;
  size_t i;
  size_t depth_local;
  size_t N_local;
  cacheblock_t *cache_local;
  
  for (uStack_28 = 0; uStack_28 < N; uStack_28 = uStack_28 + 1) {
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (local_2c < 4) {
        bVar1 = cache[uStack_28].ptr[depth + local_2c] != '\0';
      }
      if (!bVar1) break;
      cache[uStack_28].bytes[local_2c] = cache[uStack_28].ptr[depth + local_2c];
      local_2c = local_2c + 1;
    }
    for (; local_2c < 4; local_2c = local_2c + 1) {
      cache[uStack_28].bytes[local_2c] = '\0';
    }
  }
  return;
}

Assistant:

static void
fill_cache(cacheblock_t* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CACHED_BYTES && cache[i].ptr[depth+j]) {
			cache[i].bytes[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CACHED_BYTES) {
			cache[i].bytes[j] = 0;
			++j;
		}
	}
}